

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O2

int32_t grow_data(ecs_world_t *world,ecs_table_t *table,ecs_data_t *data,int32_t to_add,int32_t size
                 ,ecs_entity_t *ids)

{
  ecs_vector_t **array_inout;
  ecs_c_info_t **ppeVar1;
  int *piVar2;
  ecs_sw_column_t *peVar3;
  int32_t iVar4;
  int32_t iVar5;
  void *pvVar6;
  ulong uVar7;
  ecs_entity_t *entities;
  ulong uVar8;
  ecs_c_info_t *c_info;
  ecs_bitset_t *bs;
  size_t __n;
  ecs_column_t *column;
  bool bVar9;
  int32_t bs_column_count;
  int32_t sw_column_count;
  int32_t column_count;
  ecs_world_t *local_58;
  void *local_50;
  ecs_bs_column_t *bs_columns;
  ecs_sw_column_t *sw_columns;
  ecs_column_t *columns;
  
  _ecs_assert(table != (ecs_table_t *)0x0,0xc,(char *)0x0,"table != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/table.c"
              ,0x3f4);
  if (table == (ecs_table_t *)0x0) {
    __assert_fail("table != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/table.c"
                  ,0x3f4,
                  "int32_t grow_data(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, const ecs_entity_t *)"
                 );
  }
  _ecs_assert(data != (ecs_data_t *)0x0,0xc,(char *)0x0,"data != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/table.c"
              ,0x3f5);
  if (data == (ecs_data_t *)0x0) {
    __assert_fail("data != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/table.c"
                  ,0x3f5,
                  "int32_t grow_data(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, const ecs_entity_t *)"
                 );
  }
  iVar4 = ecs_table_data_count(data);
  column_count = table->column_count;
  sw_column_count = table->sw_column_count;
  bs_column_count = table->bs_column_count;
  columns = (ecs_column_t *)0x0;
  sw_columns = (ecs_sw_column_t *)0x0;
  bs_columns = (ecs_bs_column_t *)0x0;
  local_58 = world;
  ensure_data(world,table,data,&column_count,&sw_column_count,&bs_column_count,&columns,&sw_columns,
              &bs_columns);
  array_inout = &data->record_ptrs;
  _ecs_vector_set_size(array_inout,8,0x10,size);
  pvVar6 = _ecs_vector_addn(array_inout,8,0x10,to_add);
  _ecs_assert(pvVar6 != (void *)0x0,0xc,(char *)0x0,"r != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/table.c"
              ,0x404);
  if (pvVar6 == (void *)0x0) {
    __assert_fail("r != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/table.c"
                  ,0x404,
                  "int32_t grow_data(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, const ecs_entity_t *)"
                 );
  }
  local_50 = pvVar6;
  iVar5 = ecs_vector_size(*array_inout);
  if (size < iVar5) {
    size = ecs_vector_size(*array_inout);
  }
  _ecs_vector_set_size(&data->entities,8,0x10,size);
  pvVar6 = _ecs_vector_addn(&data->entities,8,0x10,to_add);
  _ecs_assert(pvVar6 != (void *)0x0,0xc,(char *)0x0,"e != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/table.c"
              ,0x40c);
  if (pvVar6 == (void *)0x0) {
    __assert_fail("e != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/table.c"
                  ,0x40c,
                  "int32_t grow_data(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, const ecs_entity_t *)"
                 );
  }
  iVar5 = ecs_vector_size(data->entities);
  _ecs_assert(iVar5 == size,0xc,(char *)0x0,"ecs_vector_size(data->entities) == size",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/table.c"
              ,0x40d);
  iVar5 = ecs_vector_size(data->entities);
  if (iVar5 != size) {
    __assert_fail("ecs_vector_size(data->entities) == size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/table.c"
                  ,0x40d,
                  "int32_t grow_data(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, const ecs_entity_t *)"
                 );
  }
  if (ids == (ecs_entity_t *)0x0) {
    __n = (size_t)(to_add * 8);
    memset(pvVar6,0,__n);
  }
  else {
    uVar7 = 0;
    uVar8 = 0;
    if (0 < to_add) {
      uVar8 = (ulong)(uint)to_add;
    }
    for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      *(ecs_entity_t *)((long)pvVar6 + uVar7 * 8) = ids[uVar7];
    }
    __n = (size_t)(to_add * 8);
  }
  uVar8 = 0;
  memset(local_50,0,__n);
  ppeVar1 = table->c_info;
  entities = (ecs_entity_t *)_ecs_vector_first(data->entities,8,0x10);
  column = columns;
  uVar7 = (ulong)(uint)column_count;
  if (column_count < 1) {
    uVar7 = uVar8;
  }
  do {
    peVar3 = sw_columns;
    if (uVar7 == uVar8) {
      uVar8 = 0;
      uVar7 = (ulong)(uint)sw_column_count;
      if (sw_column_count < 1) {
        uVar7 = uVar8;
      }
      for (; uVar7 * 0x10 != uVar8; uVar8 = uVar8 + 0x10) {
        ecs_switch_addn(*(ecs_switch_t **)((long)&peVar3->data + uVar8),to_add);
      }
      uVar7 = 0;
      bs = &bs_columns->data;
      if (0 < bs_column_count) {
        uVar7 = (ulong)(uint)bs_column_count;
      }
      while (bVar9 = uVar7 != 0, uVar7 = uVar7 - 1, bVar9) {
        ecs_bitset_addn(bs,to_add);
        bs = bs + 1;
      }
      piVar2 = table->dirty_state;
      if (piVar2 != (int *)0x0) {
        *piVar2 = *piVar2 + 1;
      }
      if (iVar4 == 0 && local_58->in_progress == false) {
        ecs_table_activate(local_58,table,(ecs_query_t *)0x0,true);
      }
      table->alloc_count = table->alloc_count + 1;
      return iVar4;
    }
    if (column->size != 0) {
      if (ppeVar1 == (ecs_c_info_t **)0x0) {
        c_info = (ecs_c_info_t *)0x0;
      }
      else {
        c_info = ppeVar1[uVar8];
      }
      grow_column(local_58,entities,column,c_info,to_add,size,true);
      iVar5 = ecs_vector_size(column->data);
      _ecs_assert(iVar5 == size,0xc,(char *)0x0,"ecs_vector_size(columns[i].data) == size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/table.c"
                  ,0x42a);
      iVar5 = ecs_vector_size(column->data);
      if (iVar5 != size) {
        __assert_fail("ecs_vector_size(columns[i].data) == size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/table.c"
                      ,0x42a,
                      "int32_t grow_data(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, const ecs_entity_t *)"
                     );
      }
    }
    uVar8 = uVar8 + 1;
    column = column + 1;
  } while( true );
}

Assistant:

static
int32_t grow_data(
    ecs_world_t * world,
    ecs_table_t * table,
    ecs_data_t * data,
    int32_t to_add,
    int32_t size,
    const ecs_entity_t *ids)
{
    ecs_assert(table != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(data != NULL, ECS_INTERNAL_ERROR, NULL);

    int32_t cur_count = ecs_table_data_count(data);
    int32_t column_count = table->column_count;
    int32_t sw_column_count = table->sw_column_count;
    int32_t bs_column_count = table->bs_column_count;
    ecs_column_t *columns = NULL;
    ecs_sw_column_t *sw_columns = NULL;
    ecs_bs_column_t *bs_columns = NULL;
    ensure_data(world, table, data, &column_count, &sw_column_count, 
        &bs_column_count, &columns, &sw_columns, &bs_columns);    

    /* Add record to record ptr array */
    ecs_vector_set_size(&data->record_ptrs, ecs_record_t*, size);
    ecs_record_t **r = ecs_vector_addn(&data->record_ptrs, ecs_record_t*, to_add);
    ecs_assert(r != NULL, ECS_INTERNAL_ERROR, NULL);
    if (ecs_vector_size(data->record_ptrs) > size) {
        size = ecs_vector_size(data->record_ptrs);
    }

    /* Add entity to column with entity ids */
    ecs_vector_set_size(&data->entities, ecs_entity_t, size);
    ecs_entity_t *e = ecs_vector_addn(&data->entities, ecs_entity_t, to_add);
    ecs_assert(e != NULL, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(ecs_vector_size(data->entities) == size, ECS_INTERNAL_ERROR, NULL);

    /* Initialize entity ids and record ptrs */
    int32_t i;
    if (ids) {
        for (i = 0; i < to_add; i ++) {
            e[i] = ids[i];
        }
    } else {
        ecs_os_memset(e, 0, ECS_SIZEOF(ecs_entity_t) * to_add);
    }
    ecs_os_memset(r, 0, ECS_SIZEOF(ecs_record_t*) * to_add);

    /* Add elements to each column array */
    ecs_c_info_t **c_info_array = table->c_info;
    ecs_entity_t *entities = ecs_vector_first(data->entities, ecs_entity_t);
    for (i = 0; i < column_count; i ++) {
        ecs_column_t *column = &columns[i];
        if (!column->size) {
            continue;
        }

        ecs_c_info_t *c_info = NULL;
        if (c_info_array) {
            c_info = c_info_array[i];
        }

        grow_column(world, entities, column, c_info, to_add, size, true);
        ecs_assert(ecs_vector_size(columns[i].data) == size, 
            ECS_INTERNAL_ERROR, NULL);
    }

    /* Add elements to each switch column */
    for (i = 0; i < sw_column_count; i ++) {
        ecs_switch_t *sw = sw_columns[i].data;
        ecs_switch_addn(sw, to_add);
    }

    /* Add elements to each bitset column */
    for (i = 0; i < bs_column_count; i ++) {
        ecs_bitset_t *bs = &bs_columns[i].data;
        ecs_bitset_addn(bs, to_add);
    }

    /* If the table is monitored indicate that there has been a change */
    mark_table_dirty(table, 0);

    if (!world->in_progress && !cur_count) {
        ecs_table_activate(world, table, 0, true);
    }

    table->alloc_count ++;

    /* Return index of first added entity */
    return cur_count;
}